

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int64_t dist_block_px_domain
                  (AV1_COMP *cpi,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int block,
                  int blk_row,int blk_col,TX_SIZE tx_size)

{
  BLOCK_SIZE BVar1;
  _Bool _Var2;
  ushort uVar3;
  int iVar4;
  int a_stride;
  tran_low_t *ptVar5;
  MB_MODE_INFO *pMVar6;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var7;
  uint64_t uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint16_t *puVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  char cVar19;
  uint16_t *local_2080;
  uint32_t local_203c;
  uint16_t recon16 [4096];
  
  ptVar5 = x->plane[plane].dqcoeff;
  uVar3 = x->plane[plane].eobs[block];
  uVar13 = (ulong)tx_size;
  BVar1 = txsize_to_bsize[uVar13];
  iVar4 = (x->e_mbd).plane[plane].dst.stride;
  a_stride = x->plane[plane].src.stride;
  puVar15 = x->plane[plane].src.buf;
  puVar14 = (uint16_t *)((x->e_mbd).plane[plane].dst.buf + (iVar4 * blk_row + blk_col) * 4);
  uVar16 = (uint)block_size_wide[BVar1];
  uVar18 = (uint)block_size_high[BVar1];
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    pp_Var7 = &aom_convolve_copy;
    local_2080 = recon16;
  }
  else {
    local_2080 = (uint16_t *)((ulong)recon16 >> 1);
    puVar14 = (uint16_t *)((long)puVar14 * 2);
    pp_Var7 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
              &aom_highbd_convolve_copy;
  }
  (**pp_Var7)(puVar14,(long)iVar4,recon16,0x40,uVar16,uVar18);
  _Var2 = (cpi->common).features.reduced_tx_set_used;
  pMVar6 = *(x->e_mbd).mi;
  if (((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar13 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      bVar9 = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
    }
    else {
      cVar19 = (char)*(ushort *)&pMVar6->field_0xa7;
      if ((cVar19 < '\0') || ('\0' < pMVar6->ref_frame[0])) {
        bVar9 = (x->e_mbd).tx_type_map
                [(blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                 (x->e_mbd).tx_type_map_stride +
                 (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f))];
        uVar10 = 1;
        if (-1 < cVar19) {
          uVar10 = (uint)('\0' < pMVar6->ref_frame[0]);
        }
      }
      else {
        bVar9 = intra_mode_to_tx_type__intra_mode_to_tx_type
                [(byte)get_uv_mode_uv2y[pMVar6->uv_mode]];
        uVar10 = 0;
      }
      if ((0x18608UL >> (uVar13 & 0x3f) & 1) == 0) {
        if (_Var2 == false) {
          uVar10 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) + (ulong)(uVar10 * 2)];
        }
        else {
          uVar10 = (uint)(byte)((uVar10 == 0) + 1);
        }
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)bVar9 * 4 + (ulong)(uVar10 << 6)) == 0) {
        bVar9 = 0;
      }
    }
  }
  else {
    bVar9 = 0;
  }
  av1_inverse_transform_block
            (&x->e_mbd,ptVar5 + (block << 4),plane,bVar9,tx_size,(uint8_t *)local_2080,0x40,
             (uint)uVar3,(uint)_Var2);
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  uVar10 = uVar18;
  if (iVar4 < 0) {
    uVar11 = (uint)block_size_high[plane_bsize] + blk_row * -4 +
             (iVar4 >> ((char)(x->e_mbd).plane[plane].subsampling_y + 3U & 0x1f));
    uVar17 = uVar18;
    if ((int)uVar11 < (int)uVar18) {
      uVar17 = uVar11;
    }
    uVar10 = 0;
    if (-1 < (int)uVar11) {
      uVar10 = uVar17;
    }
  }
  iVar4 = (x->e_mbd).mb_to_right_edge;
  uVar17 = uVar16;
  if (iVar4 < 0) {
    uVar12 = (uint)block_size_wide[plane_bsize] + blk_col * -4 +
             (iVar4 >> ((char)(x->e_mbd).plane[plane].subsampling_x + 3U & 0x1f));
    uVar11 = uVar16;
    if ((int)uVar12 < (int)uVar16) {
      uVar11 = uVar12;
    }
    uVar17 = 0;
    if (-1 < (int)uVar12) {
      uVar17 = uVar11;
    }
  }
  puVar15 = puVar15 + (a_stride * blk_row + blk_col) * 4;
  if ((uVar10 == uVar18) && (uVar17 == uVar16)) {
    (*cpi->ppi->fn_ptr[BVar1].vf)(puVar15,a_stride,(uint8_t *)local_2080,0x40,&local_203c);
  }
  else if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    local_203c = aom_sse_odd_size(puVar15,a_stride,(uint8_t *)local_2080,0x40,uVar17,uVar10);
  }
  else {
    uVar8 = aom_highbd_sse_odd_size(puVar15,a_stride,(uint8_t *)local_2080,0x40,uVar17,uVar10);
    bVar9 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    local_203c = (uint32_t)(((uint)(1 << (bVar9 & 0x1f)) >> 1) + uVar8 >> (bVar9 & 0x3f));
  }
  return (ulong)(local_203c << 4);
}

Assistant:

static inline int64_t dist_block_px_domain(const AV1_COMP *cpi, MACROBLOCK *x,
                                           int plane, BLOCK_SIZE plane_bsize,
                                           int block, int blk_row, int blk_col,
                                           TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const uint16_t eob = p->eobs[block];
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  const int bsw = block_size_wide[tx_bsize];
  const int bsh = block_size_high[tx_bsize];
  const int src_stride = x->plane[plane].src.stride;
  const int dst_stride = xd->plane[plane].dst.stride;
  // Scale the transform block index to pixel unit.
  const int src_idx = (blk_row * src_stride + blk_col) << MI_SIZE_LOG2;
  const int dst_idx = (blk_row * dst_stride + blk_col) << MI_SIZE_LOG2;
  const uint8_t *src = &x->plane[plane].src.buf[src_idx];
  const uint8_t *dst = &xd->plane[plane].dst.buf[dst_idx];
  const tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  assert(cpi != NULL);
  assert(tx_size_wide_log2[0] == tx_size_high_log2[0]);

  uint8_t *recon;
  DECLARE_ALIGNED(16, uint16_t, recon16[MAX_TX_SQUARE]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    recon = CONVERT_TO_BYTEPTR(recon16);
    aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(dst), dst_stride,
                             CONVERT_TO_SHORTPTR(recon), MAX_TX_SIZE, bsw, bsh);
  } else {
    recon = (uint8_t *)recon16;
    aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
  }
#else
  recon = (uint8_t *)recon16;
  aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
#endif

  const PLANE_TYPE plane_type = get_plane_type(plane);
  TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                                    cpi->common.features.reduced_tx_set_used);
  av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, recon,
                              MAX_TX_SIZE, eob,
                              cpi->common.features.reduced_tx_set_used);

  return 16 * pixel_dist(cpi, x, plane, src, src_stride, recon, MAX_TX_SIZE,
                         blk_row, blk_col, plane_bsize, tx_bsize);
}